

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsPublicationSetOption(HelicsPublication pub,int option,int value,HelicsError *err)

{
  PublicationObject *pPVar1;
  
  pPVar1 = anon_unknown.dwarf_7c49a::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    (*(pPVar1->pubPtr->super_Interface)._vptr_Interface[2])
              (pPVar1->pubPtr,(ulong)(uint)option,(ulong)(uint)value);
  }
  return;
}

Assistant:

void helicsPublicationSetOption(HelicsPublication pub, int option, int value, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}